

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_srtp_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl;
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  size_t i;
  CBB contents;
  CBB profile_ids;
  CBB local_90;
  CBB local_60;
  
  ssl = (SSL *)hs->ssl;
  sk = (OPENSSL_STACK *)SSL_get_srtp_profiles(ssl);
  bVar4 = true;
  if (((sk != (OPENSSL_STACK *)0x0) && (sVar2 = OPENSSL_sk_num(sk), sVar2 != 0)) &&
     (iVar1 = SSL_is_dtls((SSL *)ssl), iVar1 != 0)) {
    iVar1 = CBB_add_u16(out_compressible,0xe);
    if (((iVar1 != 0) &&
        (iVar1 = CBB_add_u16_length_prefixed(out_compressible,&local_90), iVar1 != 0)) &&
       (iVar1 = CBB_add_u16_length_prefixed(&local_90,&local_60), iVar1 != 0)) {
      sVar2 = OPENSSL_sk_num(sk);
      if (sVar2 != 0) {
        i = 0;
        do {
          pvVar3 = OPENSSL_sk_value(sk,i);
          iVar1 = CBB_add_u16(&local_60,*(uint16_t *)((long)pvVar3 + 8));
          if (iVar1 == 0) goto LAB_0013d330;
          i = i + 1;
        } while (sVar2 != i);
      }
      iVar1 = CBB_add_u8(&local_90,'\0');
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_flush(out_compressible);
      return iVar1 != 0;
    }
LAB_0013d330:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool ext_srtp_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  const STACK_OF(SRTP_PROTECTION_PROFILE) *profiles =
      SSL_get_srtp_profiles(ssl);
  if (profiles == NULL ||                               //
      sk_SRTP_PROTECTION_PROFILE_num(profiles) == 0 ||  //
      !SSL_is_dtls(ssl)) {
    return true;
  }

  CBB contents, profile_ids;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_srtp) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &profile_ids)) {
    return false;
  }

  for (const SRTP_PROTECTION_PROFILE *profile : profiles) {
    if (!CBB_add_u16(&profile_ids, profile->id)) {
      return false;
    }
  }

  if (!CBB_add_u8(&contents, 0 /* empty use_mki value */) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}